

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O0

void test_decimal128_from_string__nan(void)

{
  undefined1 local_18 [8];
  bson_decimal128_t dec;
  
  bson_decimal128_from_string("NaN",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x138,"test_decimal128_from_string__nan","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("+NaN",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x13a,"test_decimal128_from_string__nan","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("-NaN",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x13c,"test_decimal128_from_string__nan","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("-nan",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x13e,"test_decimal128_from_string__nan","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("1e",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x140,"test_decimal128_from_string__nan","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("+nan",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x142,"test_decimal128_from_string__nan","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("nan",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x144,"test_decimal128_from_string__nan","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("Nan",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x146,"test_decimal128_from_string__nan","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("+Nan",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x148,"test_decimal128_from_string__nan","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("-Nan",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x14a,"test_decimal128_from_string__nan","IS_NAN (dec)");
    abort();
  }
  return;
}

Assistant:

static void
test_decimal128_from_string__nan (void)
{
   bson_decimal128_t dec;

   bson_decimal128_from_string ("NaN", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("+NaN", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("-NaN", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("-nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1e", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("+nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("Nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("+Nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("-Nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
}